

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall ProcessorGenerator::generate_class_definition(ProcessorGenerator *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_cpp_generator *ptVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  char *pcVar7;
  size_type *psVar8;
  pointer pptVar9;
  string ret_arg;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string parent_class;
  string local_1a8;
  string local_188;
  string local_168;
  vector<t_function_*,_std::allocator<t_function_*>_> local_148;
  string local_130;
  char *local_110;
  char *local_108;
  char local_100 [16];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            (&local_148,&this->service_->functions_);
  local_110 = local_100;
  local_108 = (char *)0x0;
  local_100[0] = '\0';
  if (this->service_->extends_ == (t_service *)0x0) {
    iVar4 = std::__cxx11::string::compare((char *)&this->style_);
    pcVar7 = "::apache::thrift::TDispatchProcessor";
    if (iVar4 == 0) {
      pcVar7 = "::apache::thrift::async::TAsyncDispatchProcessor";
    }
    std::__cxx11::string::_M_replace((ulong)&local_110,0,local_108,(ulong)pcVar7);
    if (this->generator_->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&local_110);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_110);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_header_,(this->template_header_)._M_dataplus._M_p,
                      (this->template_header_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"class ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," : public ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_110,(long)local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," protected:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar3 = this->generator_;
  piVar1 = &(ptVar3->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::std::shared_ptr<",0x12);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->if_name_)._M_dataplus._M_p,(this->if_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"> iface_;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"virtual ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->ret_type_)._M_dataplus._M_p,(this->ret_type_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"dispatchCall(",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->finish_cob_)._M_dataplus._M_p,
                      (this->finish_cob_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::apache::thrift::protocol::TProtocol* iprot, ",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::apache::thrift::protocol::TProtocol* oprot, ",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"const std::string& fname, int32_t seqid",0x27);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->call_context_)._M_dataplus._M_p,
                      (this->call_context_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") override;",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (this->generator_->gen_templates_ == true) {
    poVar5 = this->f_header_;
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"virtual ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ret_type_)._M_dataplus._M_p,(this->ret_type_)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"dispatchCallTemplated(",0x16);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->finish_cob_)._M_dataplus._M_p,
                        (this->finish_cob_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Protocol_* iprot, Protocol_* oprot, ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"const std::string& fname, int32_t seqid",0x27);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->call_context_)._M_dataplus._M_p,
                        (this->call_context_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," private:",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar3 = this->generator_;
  piVar1 = &(ptVar3->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"typedef  void (",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::*",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessFunction)(",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->finish_cob_decl_)._M_dataplus._M_p,
                      (this->finish_cob_decl_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"int32_t, ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::apache::thrift::protocol::TProtocol*, ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::apache::thrift::protocol::TProtocol*",0x26);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->call_context_decl_)._M_dataplus._M_p,
                      (this->call_context_decl_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  ptVar3 = this->generator_;
  poVar5 = this->f_header_;
  if (ptVar3->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"typedef void (",0xe);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->class_name_)._M_dataplus._M_p,
                        (this->class_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::*",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"SpecializedProcessFunction)(",0x1c);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->finish_cob_decl_)._M_dataplus._M_p,
                        (this->finish_cob_decl_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"int32_t, ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Protocol_*, Protocol_*",0x16);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->call_context_decl_)._M_dataplus._M_p,
                        (this->call_context_decl_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"struct ProcessFunctions {",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_130._M_dataplus._M_p,local_130._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ProcessFunction generic;",0x1a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  SpecializedProcessFunction specialized;",0x29);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  ProcessFunctions(ProcessFunction g, ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"SpecializedProcessFunction s) :",0x1f);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    generic(g),",0xf);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    specialized(s) {}",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  ProcessFunctions() : generic(nullptr), specialized(nullptr) ",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{}",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"};",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"typedef std::map<std::string, ProcessFunctions> ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessMap;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"typedef std::map<std::string, ProcessFunction> ",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessMap;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessMap processMap_;",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar9 = local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      poVar5 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void process_",0xd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->finish_cob_)._M_dataplus._M_p,
                          (this->finish_cob_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot"
                 ,0x69);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->call_context_)._M_dataplus._M_p,
                          (this->call_context_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (this->generator_->gen_templates_ == true) {
        poVar5 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void process_",0xd);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->finish_cob_)._M_dataplus._M_p,
                            (this->finish_cob_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"int32_t seqid, Protocol_* iprot, Protocol_* oprot",0x31);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->call_context_)._M_dataplus._M_p,
                            (this->call_context_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      iVar4 = std::__cxx11::string::compare((char *)&this->style_);
      if (iVar4 == 0) {
        iVar4 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar4 == '\0') {
          t_cpp_generator::type_name_abi_cxx11_
                    (&local_130,this->generator_,(*pptVar9)->returntype_,false,false);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x37f0a2);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_168.field_2._M_allocated_capacity = *psVar8;
            local_168.field_2._8_8_ = plVar6[3];
          }
          else {
            local_168.field_2._M_allocated_capacity = *psVar8;
            local_168._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_168._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1a8.field_2._M_allocated_capacity = *psVar8;
            local_1a8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar8;
            local_1a8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1a8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
        }
        else {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
        }
        if ((char)iVar4 == '\0') {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
        }
        poVar5 = this->f_header_;
        t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void return_",0xc);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"::apache::thrift::protocol::TProtocol* oprot, ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void* ctx",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (this->generator_->gen_templates_ == true) {
          poVar5 = this->f_header_;
          t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void return_",0xc);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Protocol_* oprot, void* ctx",0x1b);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        poVar5 = this->f_header_;
        t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void throw_",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"::apache::thrift::protocol::TProtocol* oprot, void* ctx, ",0x39);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"::apache::thrift::TDelayedException* _throw);",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (this->generator_->gen_templates_ == true) {
          poVar5 = this->f_header_;
          t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void throw_",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Protocol_* oprot, void* ctx, ",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"::apache::thrift::TDelayedException* _throw);",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar5 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," public:",8);
  paVar2 = &local_1a8.field_2;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(::std::shared_ptr<",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->if_name_)._M_dataplus._M_p,(this->if_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"> iface) :",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((this->extends_)._M_string_length != 0) {
    poVar5 = this->f_header_;
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->extends_)._M_dataplus._M_p,(this->extends_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(iface),",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  iface_(iface) {",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar9 = local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      poVar5 = this->f_header_;
      t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"processMap_[\"",0xd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"] = ",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      poVar5 = this->f_header_;
      if (this->generator_->gen_templates_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessFunctions(",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        ptVar3 = this->generator_;
        if (ptVar3->gen_templates_only_ == true) {
          poVar5 = t_generator::indent((t_generator *)ptVar3,this->f_header_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  nullptr,",10);
        }
        else {
          poVar5 = t_generator::indent((t_generator *)ptVar3,this->f_header_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  &",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(this->class_name_)._M_dataplus._M_p,
                              (this->class_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::process_",10);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar5 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  &",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->class_name_)._M_dataplus._M_p,
                            (this->class_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::process_",10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"&",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->class_name_)._M_dataplus._M_p,
                            (this->class_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::process_",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,((*pptVar9)->name_)._M_string_length)
        ;
      }
      poVar5 = this->f_header_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ptVar3 = this->generator_;
  piVar1 = &(ptVar3->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"virtual ~",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"() {}",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"};",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->generator_->gen_templates_ == true) {
    poVar5 = this->f_header_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"typedef ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->class_name_)._M_dataplus._M_p,
                        (this->class_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"< ::apache::thrift::protocol::TDummyProtocol > ",0x2f);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->service_name_)._M_dataplus._M_p,
                        (this->service_name_)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->pstyle_)._M_dataplus._M_p,(this->pstyle_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Processor;",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessorGenerator::generate_class_definition() {
  // Generate the dispatch methods
  vector<t_function*> functions = service_->get_functions();
  vector<t_function*>::iterator f_iter;

  string parent_class;
  if (service_->get_extends() != nullptr) {
    parent_class = extends_;
  } else {
    if (style_ == "Cob") {
      parent_class = "::apache::thrift::async::TAsyncDispatchProcessor";
    } else {
      parent_class = "::apache::thrift::TDispatchProcessor";
    }

    if (generator_->gen_templates_) {
      parent_class += "T<Protocol_>";
    }
  }

  // Generate the header portion
  f_header_ << template_header_ << "class " << class_name_ << " : public " << parent_class << " {"
            << endl;

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << "::std::shared_ptr<" << if_name_ << "> iface_;" << endl;
  f_header_ << indent() << "virtual " << ret_type_ << "dispatchCall(" << finish_cob_
            << "::apache::thrift::protocol::TProtocol* iprot, "
            << "::apache::thrift::protocol::TProtocol* oprot, "
            << "const std::string& fname, int32_t seqid" << call_context_ 
            << ") override;" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "virtual " << ret_type_ << "dispatchCallTemplated(" << finish_cob_
              << "Protocol_* iprot, Protocol_* oprot, "
              << "const std::string& fname, int32_t seqid" << call_context_ << ");" << endl;
  }
  indent_down();

  // Process function declarations
  f_header_ << " private:" << endl;
  indent_up();

  // Declare processMap_
  f_header_ << indent() << "typedef  void (" << class_name_ << "::*"
            << "ProcessFunction)(" << finish_cob_decl_ << "int32_t, "
            << "::apache::thrift::protocol::TProtocol*, "
            << "::apache::thrift::protocol::TProtocol*" << call_context_decl_ << ");" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "typedef void (" << class_name_ << "::*"
              << "SpecializedProcessFunction)(" << finish_cob_decl_ << "int32_t, "
              << "Protocol_*, Protocol_*" << call_context_decl_ << ");" << endl << indent()
              << "struct ProcessFunctions {" << endl << indent() << "  ProcessFunction generic;"
              << endl << indent() << "  SpecializedProcessFunction specialized;" << endl << indent()
              << "  ProcessFunctions(ProcessFunction g, "
              << "SpecializedProcessFunction s) :" << endl << indent() << "    generic(g)," << endl
              << indent() << "    specialized(s) {}" << endl << indent()
              << "  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
              << "{}" << endl << indent() << "};" << endl << indent()
              << "typedef std::map<std::string, ProcessFunctions> "
              << "ProcessMap;" << endl;
  } else {
    f_header_ << indent() << "typedef std::map<std::string, ProcessFunction> "
              << "ProcessMap;" << endl;
  }
  f_header_ << indent() << "ProcessMap processMap_;" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                      << "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, "
                         "::apache::thrift::protocol::TProtocol* oprot" << call_context_ << ");"
                      << endl;
    if (generator_->gen_templates_) {
      indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                        << "int32_t seqid, Protocol_* iprot, Protocol_* oprot" << call_context_
                        << ");" << endl;
    }
    if (style_ == "Cob") {
      // XXX Factor this out, even if it is a pain.
      string ret_arg = ((*f_iter)->get_returntype()->is_void()
                            ? ""
                            : ", const " + type_name((*f_iter)->get_returntype()) + "& _return");
      f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, "
                << "void* ctx" << ret_arg << ");" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx" << ret_arg << ");" << endl;
      }
      // XXX Don't declare throw if it doesn't exist
      f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, void* ctx, "
                << "::apache::thrift::TDelayedException* _throw);" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx, "
                  << "::apache::thrift::TDelayedException* _throw);" << endl;
      }
    }
  }

  f_header_ << " public:" << endl << indent() << class_name_ << "(::std::shared_ptr<" << if_name_
            << "> iface) :" << endl;
  if (!extends_.empty()) {
    f_header_ << indent() << "  " << extends_ << "(iface)," << endl;
  }
  f_header_ << indent() << "  iface_(iface) {" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << "processMap_[\"" << (*f_iter)->get_name() << "\"] = ";
    if (generator_->gen_templates_) {
      f_header_ << "ProcessFunctions(" << endl;
      if (generator_->gen_templates_only_) {
        indent(f_header_) << "  nullptr," << endl;
      } else {
        indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ","
                          << endl;
      }
      indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ")";
    } else {
      f_header_ << "&" << class_name_ << "::process_" << (*f_iter)->get_name();
    }
    f_header_ << ";" << endl;
  }

  indent_down();
  f_header_ << indent() << "}" << endl << endl << indent() << "virtual ~" << class_name_ << "() {}"
            << endl;
  indent_down();
  f_header_ << "};" << endl << endl;

  if (generator_->gen_templates_) {
    // Generate a backwards compatible typedef, for callers who don't know
    // about the new template-style code.
    //
    // We can't use TProtocol as the template parameter, since ProcessorT
    // provides overloaded versions of most methods, one of which accepts
    // TProtocol pointers, and one which accepts Protocol_ pointers.  This
    // results in a compile error if instantiated with Protocol_ == TProtocol.
    // Therefore, we define TDummyProtocol solely so we can use it as the
    // template parameter here.
    f_header_ << "typedef " << class_name_ << "< ::apache::thrift::protocol::TDummyProtocol > "
              << service_name_ << pstyle_ << "Processor;" << endl << endl;
  }
}